

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O2

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::CloneProperties
          (DeserializationCloner<Js::StreamReader> *this,SrcTypeId typeId,Src src,Dst dst)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  scaposition_t sVar5;
  RecyclableObject *this_00;
  undefined4 *puVar6;
  JavascriptArray *pJVar7;
  Engine *pEVar8;
  uint32 i;
  uint32 itemIndex;
  uint32 local_3c;
  Var pvStack_38;
  uint32 i_1;
  Dst value;
  
  this_00 = VarTo<Js::RecyclableObject>(dst);
  BVar4 = RecyclableObject::IsExternal(this_00);
  if (BVar4 == 0) {
    if (typeId == SCA_SparseArray) {
      pJVar7 = JavascriptArray::FromAnyArray(this_00);
      while( true ) {
        Read(this,&local_3c);
        if (local_3c == 0xffffffff) break;
        pvStack_38 = (Var)0x0;
        pEVar8 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                 ::GetEngine(&this->
                              super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                            );
        sVar5 = StreamReader::GetPosition(this->m_reader);
        SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
                  (pEVar8,sVar5,&stack0xffffffffffffffc8);
        if (pvStack_38 == (Var)0x0) {
          ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
        }
        JavascriptArray::DirectSetItemAt<void*>(pJVar7,local_3c,pvStack_38);
      }
    }
    else if (typeId == SCA_DenseArray) {
      pJVar7 = JavascriptArray::FromAnyArray(this_00);
      TVar1 = (pJVar7->super_ArrayObject).length;
      for (itemIndex = 0; TVar1 != itemIndex; itemIndex = itemIndex + 1) {
        pvStack_38 = (Var)0x0;
        pEVar8 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                 ::GetEngine(&this->
                              super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                            );
        sVar5 = StreamReader::GetPosition(this->m_reader);
        SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
                  (pEVar8,sVar5,&stack0xffffffffffffffc8);
        if (pvStack_38 != (Var)0x0) {
          JavascriptArray::DirectSetItemAt<void*>(pJVar7,itemIndex,pvStack_38);
        }
      }
    }
    ReadObjectPropertiesIntoObject(this,this_00);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                                ,0x13d,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void DeserializationCloner<Reader>::CloneProperties(SrcTypeId typeId, Src src, Dst dst)
    {
        // ScriptContext* scriptContext = GetScriptContext();
        RecyclableObject* obj = VarTo<RecyclableObject>(dst);

        if (obj->IsExternal()) // Read host object properties
        {
            Assert(false);
        }
        else // Read native object properties
        {
            // Read array index named properties
            if (typeId == SCA_DenseArray)
            {
                JavascriptArray* arr = JavascriptArray::FromAnyArray(obj); // (might be ES5Array if -ForceES5Array)
                uint32 length = arr->GetLength();
                for (uint32 i = 0; i < length; i++)
                {
                    Dst value = NULL;
                    this->GetEngine()->Clone(m_reader->GetPosition(), &value);
                    if (value)
                    {
                        arr->DirectSetItemAt(i, value); //Note: no prototype check
                    }
                }
            }
            else if (typeId == SCA_SparseArray)
            {
                JavascriptArray* arr = JavascriptArray::FromAnyArray(obj); // (might be ES5Array if -ForceES5Array)
                while (true)
                {
                    uint32 i;
                    Read(&i);
                    if (i == SCA_PROPERTY_TERMINATOR)
                    {
                        break;
                    }

                    Dst value = NULL;
                    this->GetEngine()->Clone(m_reader->GetPosition(), &value);
                    if (value == NULL)
                    {
                        this->ThrowSCADataCorrupt();
                    }

                    arr->DirectSetItemAt(i, value); //Note: no prototype check
                }
            }

            // Read non-index named properties
            ReadObjectPropertiesIntoObject(obj);
        }
    }